

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccmdutl.cpp
# Opt level: O1

char * CTcCommandUtil::get_opt_arg(int argc,char **argv,int *curarg,int optlen)

{
  int iVar1;
  
  iVar1 = *curarg;
  if (argv[iVar1][(long)optlen + 1] != '\0') {
    return argv[iVar1] + (long)optlen + 1;
  }
  if (iVar1 + 1 < argc) {
    *curarg = iVar1 + 1;
    return argv[(long)iVar1 + 1];
  }
  return (char *)0x0;
}

Assistant:

char *CTcCommandUtil::get_opt_arg(int argc, char **argv,
                                  int *curarg, int optlen)
{
    /* 
     *   if it's jammed up against the option letter, get it from the
     *   current array entry; otherwise, get it from the next array entry 
     */
    if (argv[*curarg][optlen + 1] != '\0')
    {
        /* it's attached to the same option entry */
        return argv[*curarg] + optlen + 1;
    }
    else if (*curarg + 1 < argc)
    {
        /* it's by itself as the next option entry */
        ++(*curarg);
        return argv[*curarg];
    }
    else
    {
        /* it's not present at all */
        return 0;
    }
}